

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall QWidgetTextControlPrivate::insertParagraphSeparator(QWidgetTextControlPrivate *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  MarkerType MVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  QTextBlockFormat *in_RDI;
  long in_FS_OFFSET;
  bool blockFmtChanged;
  QTextBlockFormat existingFmt;
  QTextCharFormat charFmt;
  QTextBlockFormat blockFmt;
  QTextFormat *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff24;
  undefined1 in_stack_ffffffffffffff25;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 in_stack_ffffffffffffff27;
  byte bVar10;
  byte bVar11;
  QTextCharFormat local_a8 [2];
  QTextBlockFormat local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [32];
  undefined1 *local_48;
  undefined1 *local_40;
  QTextCharFormat local_38;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::blockFormat();
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::charFormat();
  QTextFormat::clearProperty((int)&local_18);
  uVar8 = QTextFormat::hasProperty((int)&local_18);
  if ((uVar8 & 1) != 0) {
    QTextFormat::clearProperty((int)&local_18);
    QTextCharFormat::QTextCharFormat(&local_38);
    QTextCharFormat::operator=
              ((QTextCharFormat *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT16(in_stack_ffffffffffffff26,
                                 CONCAT15(in_stack_ffffffffffffff25,
                                          CONCAT14(in_stack_ffffffffffffff24,
                                                   in_stack_ffffffffffffff20)))),
               (QTextCharFormat *)in_stack_ffffffffffffff18);
    QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x71943f);
  }
  lVar9 = QTextCursor::currentList();
  if (lVar9 != 0) {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::blockFormat();
    QTextFormat::clearProperty((int)&local_48);
    QTextCursor::setBlockFormat(in_RDI + 0x88);
    MVar6 = QTextBlockFormat::marker((QTextBlockFormat *)0x7194c9);
    if (MVar6 == Checked) {
      QTextBlockFormat::setMarker
                (in_RDI,CONCAT13(in_stack_ffffffffffffff27,
                                 CONCAT12(in_stack_ffffffffffffff26,
                                          CONCAT11(in_stack_ffffffffffffff25,
                                                   in_stack_ffffffffffffff24))));
    }
    QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x7194ed);
  }
  QTextCursor::block();
  QTextBlock::text();
  bVar3 = QString::isEmpty((QString *)0x719522);
  bVar2 = false;
  bVar1 = false;
  bVar10 = 0;
  if (bVar3) {
    QTextCursor::blockFormat();
    bVar2 = true;
    uVar7 = QTextFormat::hasProperty((int)local_68);
    bVar10 = 0;
    if ((uVar7 & 1) == 0) {
      QTextCursor::blockFormat();
      bVar1 = true;
      bVar10 = QTextFormat::hasProperty((int)local_78);
      bVar10 = bVar10 ^ 0xff;
    }
  }
  bVar11 = bVar10;
  if (bVar1) {
    QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x7195c3);
  }
  if (bVar2) {
    QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x7195d9);
  }
  QString::~QString((QString *)0x7195e3);
  if ((bVar10 & 1) != 0) {
    QTextBlockFormat::QTextBlockFormat(local_88);
    QTextBlockFormat::operator=
              ((QTextBlockFormat *)
               CONCAT17(bVar11,CONCAT16(bVar10,CONCAT15(in_stack_ffffffffffffff25,
                                                        CONCAT14(in_stack_ffffffffffffff24,
                                                                 in_stack_ffffffffffffff20)))),
               (QTextBlockFormat *)in_stack_ffffffffffffff18);
    QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x719616);
    QTextCursor::blockFormat();
    bVar4 = QTextFormat::operator!=
                      ((QTextFormat *)
                       CONCAT17(bVar11,CONCAT16(bVar10,CONCAT15(in_stack_ffffffffffffff25,
                                                                CONCAT14(in_stack_ffffffffffffff24,
                                                                         in_stack_ffffffffffffff20))
                                               )),in_stack_ffffffffffffff18);
    QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x71964c);
    bVar5 = bVar4 & 1;
    QTextCharFormat::QTextCharFormat(local_a8);
    QTextCharFormat::operator=
              ((QTextCharFormat *)
               CONCAT17(bVar11,CONCAT16(bVar10,CONCAT15(bVar4,CONCAT14(in_stack_ffffffffffffff24,
                                                                       in_stack_ffffffffffffff20))))
               ,(QTextCharFormat *)in_stack_ffffffffffffff18);
    QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x71967c);
    QTextCursor::setBlockFormat(in_RDI + 0x88);
    QTextCursor::setCharFormat((QTextCharFormat *)(in_RDI + 0x88));
    if (bVar5 != 0) goto LAB_007196ea;
  }
  QTextCursor::insertBlock(in_RDI + 0x88,(QTextCharFormat *)&local_18);
LAB_007196ea:
  QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7196f7);
  QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x719704);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::insertParagraphSeparator()
{
    // clear blockFormat properties that the user is unlikely to want duplicated:
    // - don't insert <hr/> automatically
    // - the next paragraph after a heading should be a normal paragraph
    // - remove the bottom margin from the last list item before appending
    // - the next checklist item after a checked item should be unchecked
    auto blockFmt = cursor.blockFormat();
    auto charFmt = cursor.charFormat();
    blockFmt.clearProperty(QTextFormat::BlockTrailingHorizontalRulerWidth);
    if (blockFmt.hasProperty(QTextFormat::HeadingLevel)) {
        blockFmt.clearProperty(QTextFormat::HeadingLevel);
        charFmt = QTextCharFormat();
    }
    if (cursor.currentList()) {
        auto existingFmt = cursor.blockFormat();
        existingFmt.clearProperty(QTextBlockFormat::BlockBottomMargin);
        cursor.setBlockFormat(existingFmt);
        if (blockFmt.marker() == QTextBlockFormat::MarkerType::Checked)
            blockFmt.setMarker(QTextBlockFormat::MarkerType::Unchecked);
    }

    // After a blank line, reset block and char formats. I.e. you can end a list,
    // block quote, etc. by hitting enter twice, and get back to normal paragraph style.
    if (cursor.block().text().isEmpty() &&
            !cursor.blockFormat().hasProperty(QTextFormat::BlockTrailingHorizontalRulerWidth) &&
            !cursor.blockFormat().hasProperty(QTextFormat::BlockCodeLanguage)) {
        blockFmt = QTextBlockFormat();
        const bool blockFmtChanged = (cursor.blockFormat() != blockFmt);
        charFmt = QTextCharFormat();
        cursor.setBlockFormat(blockFmt);
        cursor.setCharFormat(charFmt);
        // If the user hit enter twice just to get back to default format,
        // don't actually insert a new block. But if the user then hits enter
        // yet again, the block format will not change, so we will insert a block.
        // This is what many word processors do.
        if (blockFmtChanged)
            return;
    }

    cursor.insertBlock(blockFmt, charFmt);
}